

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,wchar_t *value)

{
  allocator local_31;
  wstring local_30;
  
  if (this == (Catch *)0x0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"{null string}",(allocator *)&local_30);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&local_30,(wchar_t *)this,&local_31);
    toString(__return_storage_ptr__,&local_30);
    std::__cxx11::wstring::~wstring((wstring *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString( const wchar_t* const value )
{
	return value ? Catch::toString( std::wstring(value) ) : std::string( "{null string}" );
}